

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_init_find_case(bson_iter_t *iter,bson_t *bson,char *key)

{
  _Bool _Var1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar3 = "iter";
    uVar2 = 0xe7;
  }
  else if (bson == (bson_t *)0x0) {
    pcVar3 = "bson";
    uVar2 = 0xe8;
  }
  else {
    if (key != (char *)0x0) {
      _Var1 = bson_iter_init(iter,bson);
      if (_Var1) {
        _Var1 = bson_iter_find_case(iter,key);
        return _Var1;
      }
      return false;
    }
    pcVar3 = "key";
    uVar2 = 0xe9;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar2,"bson_iter_init_find_case",pcVar3);
  abort();
}

Assistant:

bool
bson_iter_init_find_case (bson_iter_t *iter,  /* INOUT */
                          const bson_t *bson, /* IN */
                          const char *key)    /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   return bson_iter_init (iter, bson) && bson_iter_find_case (iter, key);
}